

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack32_24(uint32_t *in,uint32_t *out)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  
  uVar5 = *(undefined8 *)(in + 2);
  uVar6 = *(undefined8 *)(in + 4);
  uVar7 = *(undefined8 *)(in + 6);
  uVar8 = *(undefined8 *)(in + 8);
  uVar9 = *(undefined8 *)(in + 10);
  uVar10 = *(undefined8 *)(in + 0xc);
  uVar11 = *(undefined8 *)(in + 0xe);
  uVar1 = *(undefined8 *)(in + 0x10);
  uVar2 = *(undefined8 *)(in + 0x12);
  uVar3 = *(undefined8 *)(in + 0x14);
  uVar4 = *(undefined8 *)(in + 0x16);
  *(undefined8 *)out = *(undefined8 *)in;
  *(undefined8 *)(out + 2) = uVar5;
  *(undefined8 *)(out + 4) = uVar6;
  *(undefined8 *)(out + 6) = uVar7;
  *(undefined8 *)(out + 8) = uVar8;
  *(undefined8 *)(out + 10) = uVar9;
  *(undefined8 *)(out + 0xc) = uVar10;
  *(undefined8 *)(out + 0xe) = uVar11;
  *(undefined8 *)(out + 0x10) = uVar1;
  *(undefined8 *)(out + 0x12) = uVar2;
  *(undefined8 *)(out + 0x14) = uVar3;
  *(undefined8 *)(out + 0x16) = uVar4;
  return in + 0x18;
}

Assistant:

const uint32_t *__fastunpack32_24(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;

  return in;
}